

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absolute.cpp
# Opt level: O1

string * fs_absolute_abi_cxx11_(string *__return_storage_ptr__,string_view path,bool expand_tilde)

{
  string_view path_00;
  bool bVar1;
  string_view fname;
  string ex;
  error_code ec;
  path a;
  _Alloc_hider in_stack_ffffffffffffff68;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  error_code local_78;
  path local_68;
  path local_40;
  
  if (path._M_len == 0) {
    fs_get_cwd_abi_cxx11_();
  }
  else {
    if (expand_tilde) {
      fs_expanduser_abi_cxx11_((string *)&stack0xffffffffffffff68,path);
    }
    else {
      in_stack_ffffffffffffff68._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xffffffffffffff68,path._M_str,path._M_str + path._M_len);
    }
    if (local_90 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      path_00._M_str = in_stack_ffffffffffffff68._M_p;
      path_00._M_len = 0x11b2ea;
      bVar1 = fs_is_absolute(path_00);
      if (bVar1) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,in_stack_ffffffffffffff68._M_p,
                   in_stack_ffffffffffffff68._M_p + local_90);
      }
      else {
        local_78._M_value = 0;
        local_78._M_cat = (error_category *)std::_V2::system_category();
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff68,auto_format);
        std::filesystem::absolute(&local_40,(error_code *)&local_68);
        std::filesystem::__cxx11::path::~path(&local_68);
        if (local_78._M_value == 0) {
          std::filesystem::__cxx11::path::
          generic_string<char,std::char_traits<char>,std::allocator<char>>
                    (__return_storage_ptr__,&local_40,(allocator<char> *)&local_68);
        }
        else {
          fname._M_str = "fs_absolute";
          fname._M_len = 0xb;
          fs_print_error(path,fname,&local_78);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        std::filesystem::__cxx11::path::~path(&local_40);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffff68._M_p != &local_88) {
      operator_delete(in_stack_ffffffffffffff68._M_p,local_88._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_absolute(std::string_view path, const bool expand_tilde)
{
  // wraps std::filesystem::absolute(path).
  // path need not exist
  // Inspired by Python pathlib.Path.absolute()
  // https://docs.python.org/3/library/pathlib.html#pathlib.Path.absolute

  // Linux, MinGW can't handle empty paths
  if(path.empty())
    return fs_get_cwd();

  const std::string ex = expand_tilde
    ? fs_expanduser(path)
    : std::string(path);

  if (ex.empty()) FFS_UNLIKELY
    return {};

  if (fs_is_absolute(ex))
    return ex;

#ifdef HAVE_CXX_FILESYSTEM
  std::error_code ec;

  const auto a = std::filesystem::absolute(ex, ec);

  if(!ec) FFS_LIKELY
    return a.generic_string();

  fs_print_error(path, __func__, ec);
  return {};
#else
  std::string a = fs_get_cwd();
  if(a.empty())
    return {};

  a.push_back('/');
  a.append(ex);

  // NOT normalized to be consistent with <filesystem>
  return a;
#endif
}